

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolver.c
# Opt level: O2

uint xSAT_SolverClaNew(xSAT_Solver_t *s,Vec_Int_t *vLits,int fLearnt)

{
  iword *piVar1;
  uint Entry;
  int iVar2;
  xSAT_WatchList_t *pxVar3;
  xSAT_Watcher_t e;
  xSAT_Clause_t *pCla;
  xSAT_Watcher_t e_00;
  
  if (vLits->nSize < 2) {
    __assert_fail("Vec_IntSize( vLits ) > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatSolver.c"
                  ,0x115,"unsigned int xSAT_SolverClaNew(xSAT_Solver_t *, Vec_Int_t *, int)");
  }
  if ((uint)fLearnt < 2) {
    Entry = xSAT_MemAppend(s->pMemory,fLearnt + vLits->nSize + 3);
    if (Entry == 0xffffffff) {
      pCla = (xSAT_Clause_t *)0x0;
    }
    else {
      pCla = (xSAT_Clause_t *)(s->pMemory->pData + (int)Entry);
    }
    *(uint *)pCla = (*(uint *)pCla & 0xfffffff0) + fLearnt * 8 | fLearnt;
    iVar2 = vLits->nSize;
    pCla->nSize = iVar2;
    memcpy(pCla + 1,vLits->pArray,(long)iVar2 << 2);
    if (fLearnt == 0) {
      Vec_IntPush(s->vClauses,Entry);
      iVar2 = vLits->nSize;
      piVar1 = &(s->Stats).nClauseLits;
      *piVar1 = *piVar1 + (long)iVar2;
    }
    else {
      Vec_IntPush(s->vLearnts,Entry);
      iVar2 = xSAT_SolverClaCalcLBD2(s,vLits);
      *(uint *)pCla = *(uint *)pCla & 0xf | iVar2 << 4;
      *(undefined4 *)(&pCla[1].field_0x0 + (long)pCla->nSize * 4) = 0;
      piVar1 = &(s->Stats).nLearntLits;
      *piVar1 = *piVar1 + (long)vLits->nSize;
      xSAT_SolverClaActBump(s,pCla);
      iVar2 = vLits->nSize;
    }
    e.Blocker = pCla[1].nSize;
    e.CRef = Entry;
    e_00.Blocker = *(uint *)(pCla + 1);
    e_00.CRef = Entry;
    pxVar3 = xSAT_VecWatchListEntry((&s->vWatches)[iVar2 == 2],*(uint *)(pCla + 1) ^ 1);
    xSAT_WatchListPush(pxVar3,e);
    pxVar3 = xSAT_VecWatchListEntry((&s->vWatches)[iVar2 == 2],pCla[1].nSize ^ 1);
    xSAT_WatchListPush(pxVar3,e_00);
    return Entry;
  }
  __assert_fail("fLearnt == 0 || fLearnt == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatSolver.c"
                ,0x116,"unsigned int xSAT_SolverClaNew(xSAT_Solver_t *, Vec_Int_t *, int)");
}

Assistant:

unsigned xSAT_SolverClaNew( xSAT_Solver_t * s, Vec_Int_t * vLits , int fLearnt )
{
    unsigned CRef;
    xSAT_Clause_t * pCla;
    xSAT_Watcher_t w1;
    xSAT_Watcher_t w2;
    unsigned nWords;

    assert( Vec_IntSize( vLits ) > 1);
    assert( fLearnt == 0 || fLearnt == 1 );

    nWords = 3 + fLearnt + Vec_IntSize( vLits );
    CRef = xSAT_MemAppend( s->pMemory, nWords );
    pCla = xSAT_SolverReadClause( s, CRef );
    pCla->fLearnt = fLearnt;
    pCla->fMark = 0;
    pCla->fReallocd = 0;
    pCla->fCanBeDel = fLearnt;
    pCla->nSize = Vec_IntSize( vLits );
    memcpy( &( pCla->pData[0].Lit ), Vec_IntArray( vLits ), sizeof( int ) * Vec_IntSize( vLits ) );

    if ( fLearnt )
    {
        Vec_IntPush( s->vLearnts, CRef );
        pCla->nLBD = xSAT_SolverClaCalcLBD2( s, vLits );
        pCla->pData[pCla->nSize].Act = 0;
        s->Stats.nLearntLits += Vec_IntSize( vLits );
        xSAT_SolverClaActBump(s, pCla);
    }
    else
    {
        Vec_IntPush( s->vClauses, CRef );
        s->Stats.nClauseLits += Vec_IntSize( vLits );
    }

    w1.CRef = CRef;
    w2.CRef = CRef;
    w1.Blocker = pCla->pData[1].Lit;
    w2.Blocker = pCla->pData[0].Lit;

    if ( Vec_IntSize( vLits ) == 2 )
    {
        xSAT_WatchListPush( xSAT_VecWatchListEntry( s->vBinWatches, xSAT_NegLit( pCla->pData[0].Lit ) ), w1 );
        xSAT_WatchListPush( xSAT_VecWatchListEntry( s->vBinWatches, xSAT_NegLit( pCla->pData[1].Lit ) ), w2 );
    }
    else
    {
        xSAT_WatchListPush( xSAT_VecWatchListEntry( s->vWatches, xSAT_NegLit( pCla->pData[0].Lit ) ), w1 );
        xSAT_WatchListPush( xSAT_VecWatchListEntry( s->vWatches, xSAT_NegLit( pCla->pData[1].Lit ) ), w2 );
    }
    return CRef;
}